

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

LabelInstr * __thiscall IR::Instr::GetOrCreateContinueLabel(Instr *this,bool isHelper)

{
  IRKind IVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr *instr;
  
  pIVar2 = this->m_next;
  if ((pIVar2 == (Instr *)0x0) ||
     (((pIVar2->m_kind != InstrKindProfiledLabel && (pIVar2->m_kind != InstrKindLabel)) ||
      ((((ulong)pIVar2[1].m_func & 2) == 0) == isHelper)))) {
    instr = LabelInstr::New(Label,this->m_func,isHelper);
    InsertAfter(this,&instr->super_Instr);
  }
  else {
    instr = (LabelInstr *)this->m_next;
    IVar1 = (instr->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  return instr;
}

Assistant:

IR::LabelInstr *
Instr::GetOrCreateContinueLabel(const bool isHelper)
{
    if (m_next && m_next->IsLabelInstr() && m_next->AsLabelInstr()->isOpHelper == isHelper)
    {
        return m_next->AsLabelInstr();
    }

    IR::LabelInstr *const label = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
    InsertAfter(label);
    return label;
}